

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O3

void __thiscall procxx::pipe_t::pipe_t(pipe_t *this)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&pipe_t::mutex);
  if (iVar1 == 0) {
    pipe((int *)this);
    uVar2 = fcntl((this->pipe_)._M_elems[0],1,0);
    fcntl((this->pipe_)._M_elems[0],2,(ulong)(uVar2 | 1));
    uVar2 = fcntl((this->pipe_)._M_elems[1],1,0);
    fcntl((this->pipe_)._M_elems[1],2,(ulong)(uVar2 | 1));
    pthread_mutex_unlock((pthread_mutex_t *)&pipe_t::mutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)&pipe_t::mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

pipe_t() {
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock{mutex};
    int pipe_result = ::pipe(&pipe_[0]);
    (void)pipe_result;

    auto flags = ::fcntl(pipe_[0], F_GETFD, 0);
    ::fcntl(pipe_[0], F_SETFD, flags | FD_CLOEXEC);

    flags = ::fcntl(pipe_[1], F_GETFD, 0);
    ::fcntl(pipe_[1], F_SETFD, flags | FD_CLOEXEC);
  }